

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O2

opj_bool t2_read_packet_header
                   (opj_t2_v2_t *p_t2,opj_tcd_tile_v2_t *p_tile,opj_tcp_v2_t *p_tcp,
                   opj_pi_iterator_t *p_pi,opj_bool *p_is_data_present,OPJ_BYTE *p_src_data,
                   OPJ_UINT32 *p_data_read,OPJ_UINT32 p_max_length,opj_packet_info_t *p_pack_info)

{
  opj_cp_v2_t *poVar1;
  opj_tcd_seg_t *poVar2;
  OPJ_BYTE *pOVar3;
  int iVar4;
  OPJ_UINT32 OVar5;
  uint uVar6;
  opj_bool oVar7;
  opj_bio_t *bio;
  OPJ_UINT32 *pOVar8;
  int iVar9;
  opj_tcd_resolution_v2_t *poVar10;
  OPJ_UINT32 leafno;
  opj_tcd_band_v2_t *poVar11;
  opj_tcd_cblk_dec_v2_t *cblk;
  uchar *puVar12;
  uint uVar13;
  opj_tcd_precinct_v2_t *poVar14;
  ulong uVar15;
  OPJ_UINT32 i;
  bool bVar16;
  OPJ_BYTE **local_90;
  OPJ_BYTE *l_current_data;
  opj_bool *local_78;
  opj_tcd_resolution_v2_t *local_70;
  OPJ_UINT32 local_68;
  uint local_64;
  opj_tcd_band_v2_t *local_60;
  opj_tcd_precinct_v2_t *local_58;
  OPJ_UINT32 *local_50;
  OPJ_BYTE *local_48;
  uchar *local_40;
  OPJ_UINT32 l_remaining_length;
  
  poVar1 = p_t2->cp;
  poVar10 = p_tile->comps[p_pi->compno].resolutions + p_pi->resno;
  l_current_data = p_src_data;
  local_78 = p_is_data_present;
  local_70 = poVar10;
  if (p_pi->layno == 0) {
    poVar11 = poVar10->bands;
    for (uVar13 = 0; uVar13 < poVar10->numbands; uVar13 = uVar13 + 1) {
      if ((poVar11->x1 != poVar11->x0) && (poVar11->y1 != poVar11->y0)) {
        iVar4 = p_pi->precno;
        poVar14 = poVar11->precincts;
        tgt_reset(poVar14[iVar4].incltree);
        tgt_reset(poVar14[iVar4].imsbtree);
        iVar9 = poVar14[iVar4].ch * poVar14[iVar4].cw;
        pOVar8 = &(poVar14[iVar4].cblks.enc)->numpassesinlayers;
        while (bVar16 = iVar9 != 0, iVar9 = iVar9 + -1, poVar10 = local_70, bVar16) {
          *(undefined8 *)(pOVar8 + -1) = 0;
          pOVar8 = pOVar8 + 0x10;
        }
      }
      poVar11 = poVar11 + 1;
    }
  }
  puVar12 = p_src_data;
  if ((((p_tcp->csty & 2) != 0) && (*p_src_data == 0xff)) && (p_src_data[1] == 0x91)) {
    puVar12 = p_src_data + 6;
    l_current_data = puVar12;
  }
  bio = bio_create();
  if (bio != (opj_bio_t *)0x0) {
    if ((poVar1->field_0x88 & 1) == 0) {
      if ((p_tcp->field_0x1628 & 1) == 0) {
        pOVar8 = &l_remaining_length;
        l_remaining_length = (p_max_length + (int)p_src_data) - (int)puVar12;
        local_90 = &l_current_data;
      }
      else {
        local_90 = &p_tcp->ppt_data;
        puVar12 = p_tcp->ppt_data;
        pOVar8 = &p_tcp->ppt_len;
      }
    }
    else {
      local_90 = &poVar1->ppm_data;
      puVar12 = poVar1->ppm_data;
      pOVar8 = &poVar1->ppm_len;
    }
    bio_init_dec(bio,puVar12,*pOVar8);
    iVar4 = bio_read(bio,1);
    if (iVar4 == 0) {
      bio_inalign(bio);
      iVar4 = bio_numbytes(bio);
      puVar12 = puVar12 + iVar4;
      bio_destroy(bio);
      if ((p_tcp->csty & 4) != 0) {
        if ((*puVar12 == 0xff) && (puVar12[1] == 0x92)) {
          puVar12 = puVar12 + 2;
        }
        else {
          puts("Error : expected EPH marker");
        }
      }
      pOVar3 = *local_90;
      uVar13 = (int)puVar12 - (int)pOVar3;
      *pOVar8 = *pOVar8 - uVar13;
      *local_90 = pOVar3 + uVar13;
      *local_78 = 0;
      *p_data_read = (int)l_current_data - (int)p_src_data;
      return 1;
    }
    poVar11 = local_70->bands;
    poVar10 = local_70;
    local_50 = pOVar8;
    local_48 = p_src_data;
    local_40 = puVar12;
    for (uVar13 = 0; puVar12 = local_40, uVar13 < poVar10->numbands; uVar13 = uVar13 + 1) {
      if ((poVar11->x1 != poVar11->x0) && (poVar11->y1 != poVar11->y0)) {
        local_58 = poVar11->precincts + p_pi->precno;
        local_68 = local_58->ch * local_58->cw;
        cblk = (local_58->cblks).dec;
        local_64 = uVar13;
        local_60 = poVar11;
        for (leafno = 0; poVar14 = local_58, poVar11 = local_60, uVar13 = local_64,
            leafno != local_68; leafno = leafno + 1) {
          if (cblk->numsegs == 0) {
            OVar5 = tgt_decode(bio,local_58->incltree,leafno,p_pi->layno + 1);
          }
          else {
            OVar5 = bio_read(bio,1);
            poVar14 = local_58;
          }
          if (OVar5 == 0) {
            cblk->numnewpasses = 0;
          }
          else {
            if (cblk->numsegs == 0) {
              iVar4 = 0;
              do {
                OVar5 = tgt_decode(bio,poVar14->imsbtree,leafno,iVar4);
                iVar4 = iVar4 + 1;
              } while (OVar5 == 0);
              cblk->numbps = (local_60->numbps - iVar4) + 2;
              cblk->numlenbits = 3;
            }
            OVar5 = t2_getnumpasses(bio);
            cblk->numnewpasses = OVar5;
            iVar4 = t2_getcommacode(bio);
            cblk->numlenbits = cblk->numlenbits + iVar4;
            uVar13 = cblk->numsegs;
            if (uVar13 == 0) {
              uVar15 = 0;
              iVar4 = t2_init_seg_v2(cblk,0,p_tcp->tccps[p_pi->compno].cblksty,1);
LAB_001f92ec:
              if (iVar4 == 0) goto LAB_001f937e;
            }
            else {
              uVar15 = (ulong)(uVar13 - 1);
              if (cblk->segs[uVar15].numpasses == cblk->segs[uVar15].maxpasses) {
                iVar4 = t2_init_seg_v2(cblk,uVar13,p_tcp->tccps[p_pi->compno].cblksty,0);
                uVar15 = (ulong)uVar13;
                goto LAB_001f92ec;
              }
            }
            uVar13 = cblk->numnewpasses;
            while( true ) {
              poVar2 = cblk->segs;
              uVar6 = poVar2[uVar15].maxpasses - poVar2[uVar15].numpasses;
              if ((int)uVar13 <= (int)uVar6) {
                uVar6 = uVar13;
              }
              poVar2[uVar15].numnewpasses = uVar6;
              OVar5 = cblk->numlenbits;
              for (; 1 < uVar6; uVar6 = uVar6 >> 1) {
                OVar5 = OVar5 + 1;
              }
              OVar5 = bio_read(bio,OVar5);
              poVar2 = cblk->segs;
              poVar2[uVar15].newlen = OVar5;
              uVar13 = uVar13 - poVar2[uVar15].numnewpasses;
              if ((int)uVar13 < 1) break;
              uVar6 = (int)uVar15 + 1;
              uVar15 = (ulong)uVar6;
              oVar7 = t2_init_seg_v2(cblk,uVar6,p_tcp->tccps[p_pi->compno].cblksty,0);
              if (oVar7 == 0) goto LAB_001f937e;
            }
          }
          cblk = cblk + 1;
          poVar10 = local_70;
          pOVar8 = local_50;
          p_src_data = local_48;
        }
      }
      poVar11 = poVar11 + 1;
    }
    iVar4 = bio_inalign(bio);
    if (iVar4 == 0) {
      iVar4 = bio_numbytes(bio);
      puVar12 = puVar12 + iVar4;
      bio_destroy(bio);
      if (((p_tcp->csty & 4) != 0) && (*puVar12 == 0xff)) {
        puVar12 = puVar12 + (ulong)(puVar12[1] == 0x92) * 2;
      }
      pOVar3 = *local_90;
      uVar13 = (int)puVar12 - (int)pOVar3;
      *pOVar8 = *pOVar8 - uVar13;
      *local_90 = pOVar3 + uVar13;
      *local_78 = 1;
      *p_data_read = (int)l_current_data - (int)p_src_data;
      return 1;
    }
LAB_001f937e:
    bio_destroy(bio);
  }
  return 0;
}

Assistant:

static opj_bool t2_read_packet_header(
							 opj_t2_v2_t* p_t2,
							 opj_tcd_tile_v2_t *p_tile,
                             opj_tcp_v2_t *p_tcp,
							 opj_pi_iterator_t *p_pi,
							 opj_bool * p_is_data_present,
							 OPJ_BYTE *p_src_data,
							 OPJ_UINT32 * p_data_read,
							 OPJ_UINT32 p_max_length,
							 opj_packet_info_t *p_pack_info)
{
	/* loop */
	OPJ_UINT32 bandno, cblkno;
	OPJ_UINT32 l_nb_code_blocks;
	OPJ_UINT32 l_remaining_length;
	OPJ_UINT32 l_header_length;
	OPJ_UINT32 * l_modified_length_ptr = 00;
	OPJ_BYTE *l_current_data = p_src_data;
	opj_cp_v2_t *l_cp = p_t2->cp;
	opj_bio_t *l_bio = 00;	/* BIO component */
	opj_tcd_band_v2_t *l_band = 00;
	opj_tcd_cblk_dec_v2_t* l_cblk = 00;
	opj_tcd_resolution_v2_t* l_res = &p_tile->comps[p_pi->compno].resolutions[p_pi->resno];

	OPJ_BYTE *l_header_data = 00;
	OPJ_BYTE **l_header_data_start = 00;

	OPJ_UINT32 l_present;

	if (p_pi->layno == 0) {
		l_band = l_res->bands;

		/* reset tagtrees */
		for (bandno = 0; bandno < l_res->numbands; ++bandno) {
			opj_tcd_precinct_v2_t *l_prc = &l_band->precincts[p_pi->precno];

			if ( ! ((l_band->x1-l_band->x0 == 0)||(l_band->y1-l_band->y0 == 0)) ) {
				tgt_reset(l_prc->incltree);
				tgt_reset(l_prc->imsbtree);
				l_cblk = l_prc->cblks.dec;

				l_nb_code_blocks = l_prc->cw * l_prc->ch;
				for (cblkno = 0; cblkno < l_nb_code_blocks; ++cblkno) {
					l_cblk->numsegs = 0;
					l_cblk->real_num_segs = 0;
					++l_cblk;
				}
			}

			++l_band;
		}
	}

	/* SOP markers */

	if (p_tcp->csty & J2K_CP_CSTY_SOP) {
		if ((*l_current_data) != 0xff || (*(l_current_data + 1) != 0x91)) {
			/* TODO opj_event_msg(t2->cinfo->event_mgr, EVT_WARNING, "Expected SOP marker\n"); */
		} else {
			l_current_data += 6;
		}

		/** TODO : check the Nsop value */
	}

	/*
	When the marker PPT/PPM is used the packet header are store in PPT/PPM marker
	This part deal with this caracteristic
	step 1: Read packet header in the saved structure
	step 2: Return to codestream for decoding
	*/

	l_bio = bio_create();
	if (! l_bio) {
		return OPJ_FALSE;
	}

	if (l_cp->ppm == 1) { /* PPM */
		l_header_data_start = &l_cp->ppm_data;
		l_header_data = *l_header_data_start;
		l_modified_length_ptr = &(l_cp->ppm_len);

	}
	else if (p_tcp->ppt == 1) { /* PPT */
		l_header_data_start = &(p_tcp->ppt_data);
		l_header_data = *l_header_data_start;
		l_modified_length_ptr = &(p_tcp->ppt_len);
	}
	else {	/* Normal Case */
		l_header_data_start = &(l_current_data);
		l_header_data = *l_header_data_start;
		l_remaining_length = p_src_data+p_max_length-l_header_data;
		l_modified_length_ptr = &(l_remaining_length);
	}

	bio_init_dec(l_bio, l_header_data,*l_modified_length_ptr);

	l_present = bio_read(l_bio, 1);
	if (!l_present) {
		bio_inalign(l_bio);
		l_header_data += bio_numbytes(l_bio);
		bio_destroy(l_bio);

		/* EPH markers */
		if (p_tcp->csty & J2K_CP_CSTY_EPH) {
			if ((*l_header_data) != 0xff || (*(l_header_data + 1) != 0x92)) {
				printf("Error : expected EPH marker\n");
			} else {
				l_header_data += 2;
			}
		}

		l_header_length = (l_header_data - *l_header_data_start);
		*l_modified_length_ptr -= l_header_length;
		*l_header_data_start += l_header_length;

		/* << INDEX */
		/* End of packet header position. Currently only represents the distance to start of packet
		   Will be updated later by incrementing with packet start value */
		if (p_pack_info) {
			p_pack_info->end_ph_pos = (OPJ_INT32)(l_current_data - p_src_data);
		}
		/* INDEX >> */

		* p_is_data_present = OPJ_FALSE;
		*p_data_read = l_current_data - p_src_data;
		return OPJ_TRUE;
	}

	l_band = l_res->bands;
	for (bandno = 0; bandno < l_res->numbands; ++bandno) {
		opj_tcd_precinct_v2_t *l_prc = &(l_band->precincts[p_pi->precno]);

		if ((l_band->x1-l_band->x0 == 0)||(l_band->y1-l_band->y0 == 0)) {
			++l_band;
			continue;
		}

		l_nb_code_blocks = l_prc->cw * l_prc->ch;
		l_cblk = l_prc->cblks.dec;
		for (cblkno = 0; cblkno < l_nb_code_blocks; cblkno++) {
			OPJ_UINT32 l_included,l_increment, l_segno;
			OPJ_INT32 n;

			/* if cblk not yet included before --> inclusion tagtree */
			if (!l_cblk->numsegs) {
				l_included = tgt_decode(l_bio, l_prc->incltree, cblkno, p_pi->layno + 1);
				/* else one bit */
			}
			else {
				l_included = bio_read(l_bio, 1);
			}

			/* if cblk not included */
			if (!l_included) {
				l_cblk->numnewpasses = 0;
				++l_cblk;
				continue;
			}

			/* if cblk not yet included --> zero-bitplane tagtree */
			if (!l_cblk->numsegs) {
				OPJ_UINT32 i = 0;

				while (!tgt_decode(l_bio, l_prc->imsbtree, cblkno, i)) {
					++i;
				}

				l_cblk->numbps = l_band->numbps + 1 - i;
				l_cblk->numlenbits = 3;
			}

			/* number of coding passes */
			l_cblk->numnewpasses = t2_getnumpasses(l_bio);
			l_increment = t2_getcommacode(l_bio);

			/* length indicator increment */
			l_cblk->numlenbits += l_increment;
			l_segno = 0;

			if (!l_cblk->numsegs) {
				if (! t2_init_seg_v2(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 1)) {
					bio_destroy(l_bio);
					return OPJ_FALSE;
				}
			}
			else {
				l_segno = l_cblk->numsegs - 1;
				if (l_cblk->segs[l_segno].numpasses == l_cblk->segs[l_segno].maxpasses) {
					++l_segno;
					if (! t2_init_seg_v2(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 0)) {
						bio_destroy(l_bio);
						return OPJ_FALSE;
					}
				}
			}
			n = l_cblk->numnewpasses;

			do {
				l_cblk->segs[l_segno].numnewpasses = int_min(l_cblk->segs[l_segno].maxpasses - l_cblk->segs[l_segno].numpasses, n);
				l_cblk->segs[l_segno].newlen = bio_read(l_bio, l_cblk->numlenbits + uint_floorlog2(l_cblk->segs[l_segno].numnewpasses));

				n -= l_cblk->segs[l_segno].numnewpasses;
				if (n > 0) {
					++l_segno;

					if (! t2_init_seg_v2(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 0)) {
						bio_destroy(l_bio);
						return OPJ_FALSE;
					}
				}
			} while (n > 0);

			++l_cblk;
		}

		++l_band;
	}

	if (bio_inalign(l_bio)) {
		bio_destroy(l_bio);
		return OPJ_FALSE;
	}

	l_header_data += bio_numbytes(l_bio);
	bio_destroy(l_bio);

	/* EPH markers */
	if (p_tcp->csty & J2K_CP_CSTY_EPH) {
		if ((*l_header_data) != 0xff || (*(l_header_data + 1) != 0x92)) {
			/* TODO opj_event_msg(t2->cinfo->event_mgr, EVT_ERROR, "Expected EPH marker\n"); */
		} else {
			l_header_data += 2;
		}
	}

	l_header_length = (l_header_data - *l_header_data_start);
	*l_modified_length_ptr -= l_header_length;
	*l_header_data_start += l_header_length;

	/* << INDEX */
	/* End of packet header position. Currently only represents the distance to start of packet
	 Will be updated later by incrementing with packet start value */
	if (p_pack_info) {
		p_pack_info->end_ph_pos = (OPJ_INT32)(l_current_data - p_src_data);
	}
	/* INDEX >> */

	*p_is_data_present = OPJ_TRUE;
	*p_data_read = l_current_data - p_src_data;

	return OPJ_TRUE;
}